

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRExtension * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::allocate<spirv_cross::SPIRExtension&>
          (ObjectPool<spirv_cross::SPIRExtension> *this,SPIRExtension *p)

{
  uint uVar1;
  SPIRExtension *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRExtension **ppSVar4;
  SPIRExtension *ptr;
  uint local_34;
  SPIRExtension *pSStack_30;
  uint i;
  SPIRExtension *ptr_1;
  SPIRExtension *pSStack_20;
  uint num_objects;
  SPIRExtension *p_local;
  ObjectPool<spirv_cross::SPIRExtension> *this_local;
  
  pSStack_20 = p;
  p_local = (SPIRExtension *)this;
  bVar2 = VectorView<spirv_cross::SPIRExtension_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRExtension,_spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRExtension,_spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRExtension *)malloc((ulong)ptr_1._4_4_ << 4);
    if (pSStack_30 == (SPIRExtension *)0x0) {
      return (SPIRExtension *)0x0;
    }
    SmallVector<spirv_cross::SPIRExtension_*,_0UL>::reserve(&this->vacants,(ulong)ptr_1._4_4_);
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<spirv_cross::SPIRExtension_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRExtension*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRExtension_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>);
  this_00 = *ppSVar4;
  SmallVector<spirv_cross::SPIRExtension_*,_0UL>::pop_back(&this->vacants);
  SPIRExtension::SPIRExtension(this_00,pSStack_20);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}